

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

Fl_Type * __thiscall Fl_CodeBlock_Type::make(Fl_CodeBlock_Type *this)

{
  Fl_Type **ppFVar1;
  int iVar2;
  Fl_Type *this_00;
  Fl_Type *p;
  
  p = Fl_Type::current;
  if (Fl_Type::current != (Fl_Type *)0x0) {
    do {
      iVar2 = (*p->_vptr_Fl_Type[0x23])(p);
      if (iVar2 != 0) {
        this_00 = (Fl_Type *)operator_new(0x80);
        Fl_Type::Fl_Type(this_00);
        this_00->_vptr_Fl_Type = (_func_int **)&PTR_setlabel_00270950;
        this_00[1]._vptr_Fl_Type = (_func_int **)0x0;
        Fl_Type::name(this_00,"if (test())");
        this_00[1]._vptr_Fl_Type = (_func_int **)0x0;
        Fl_Type::add(this_00,p);
        this_00->factory = &this->super_Fl_Type;
        return this_00;
      }
      ppFVar1 = &p->parent;
      p = *ppFVar1;
    } while (*ppFVar1 != (Fl_Type *)0x0);
  }
  fl_message("Please select a function");
  return (Fl_Type *)0x0;
}

Assistant:

Fl_Type *Fl_CodeBlock_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_code_block()) p = p->parent;
  if (!p) {
    fl_message("Please select a function");
    return 0;
  }
  Fl_CodeBlock_Type *o = new Fl_CodeBlock_Type();
  o->name("if (test())");
  o->after = 0;
  o->add(p);
  o->factory = this;
  return o;
}